

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# occurrencetocsv.cpp
# Opt level: O3

void occ_doit<occurrence>(occurrence *q)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  short sVar4;
  int iVar5;
  short sVar6;
  int iVar7;
  int occ_day;
  int occ_month;
  int occ_year;
  
  sVar3 = fread(q,0xc,1,_stdin);
  if ((int)sVar3 != 0) {
    do {
      iVar1 = granular_date_;
      iVar7 = q->occ_date_id;
      iVar5 = 0x5a0;
      if (granular_date_ == 0) {
        iVar5 = 1;
      }
      d((long)(iVar7 / iVar5),&occ_year,&occ_month,&occ_day);
      if (iVar1 == 0) {
        printf("%d,%d,%d,%d,%d\n",(ulong)(uint)q->event_id,(ulong)(uint)q->period_no,
               (ulong)(uint)occ_year,(ulong)(uint)occ_month,(ulong)(uint)occ_day);
      }
      else {
        iVar7 = iVar7 % 0x5a0;
        sVar6 = (short)iVar7;
        uVar2 = ((uint)(sVar6 * -0x7777) >> 0x10) + iVar7;
        sVar4 = ((short)uVar2 >> 5) + (short)((uVar2 & 0xffff) >> 0xf);
        printf("%d,%d,%d,%d,%d,%d,%d\n",(ulong)(uint)q->event_id,(ulong)(uint)q->period_no,
               (ulong)(uint)occ_year,(ulong)(uint)occ_month,(ulong)(uint)occ_day,
               (ulong)(uint)(int)sVar4,(ulong)(uint)(int)(short)(sVar6 + sVar4 * -0x3c));
      }
      sVar3 = fread(q,0xc,1,_stdin);
    } while ((int)sVar3 != 0);
  }
  return;
}

Assistant:

void occ_doit(T &q)
{

	int occ_year, occ_month, occ_day;
	int occ_hour = 0;
	int occ_minute = 0;
	int i = fread(&q, sizeof(q), 1, stdin);
	while (i != 0) {
		int days = q.occ_date_id / (1440 - 1439 * !granular_date_);
		d(days, occ_year, occ_month, occ_day);
		if (granular_date_) {
			int minutes = q.occ_date_id % 1440;
			occ_hour = minutes / 60;
			occ_minute = minutes % 60;
			printf("%d,%d,%d,%d,%d,%d,%d\n", q.event_id,
			       q.period_no, occ_year, occ_month, occ_day,
			       occ_hour, occ_minute);
		} else {
			printf("%d,%d,%d,%d,%d\n",  q.event_id, q.period_no,
			       occ_year, occ_month, occ_day);
		}
		i = fread(&q, sizeof(q), 1, stdin);
	}

}